

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall Tigre::String::String(String *this,String *s)

{
  String *s_local;
  String *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)s);
  return;
}

Assistant:

Tigre::String::String(const String &s) {
    this->value = s.value;
}